

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O1

void __thiscall
IsorecursiveTest_CanonicalizeBasicTypes_Test::~IsorecursiveTest_CanonicalizeBasicTypes_Test
          (IsorecursiveTest_CanonicalizeBasicTypes_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeBasicTypes) {
  TypeBuilder builder(5);

  Type anyref = builder.getTempRefType(builder[0], Nullable);
  Type anyrefs = builder.getTempTupleType({anyref, anyref});

  Type anyrefCanon = Type(HeapType::any, Nullable);

  builder[0] = HeapType::any;
  builder[1] = Struct({Field(anyref, Immutable)});
  builder[2] = Struct({Field(anyrefCanon, Immutable)});
  builder[3] = Signature(anyrefs, Type::none);
  builder[4] = Signature({anyrefCanon, anyrefCanon}, Type::none);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[1], built[2]);
  EXPECT_EQ(built[3], built[4]);
}